

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_amigahunk.c
# Opt level: O1

Symbol * ados_lnksym(GlobalVars *gv,Section *sec,Reloc *xref)

{
  char *__s1;
  int iVar1;
  Symbol *pSVar2;
  Symbol *pSVar3;
  char **ppcVar4;
  char *pcVar5;
  long lVar6;
  uint uVar7;
  
  if (gv->dest_object == 0) {
    pcVar5 = xref->xrefname;
    ppcVar4 = ados_symnames;
    lVar6 = 0;
    do {
      __s1 = *ppcVar4;
      iVar1 = strcmp(__s1,pcVar5);
      if (iVar1 == 0) {
        uVar7 = -(int)lVar6;
        if ((uVar7 & 0x1e) == 6) {
          pcVar5 = "___DTOR_LIST__";
          if (lVar6 == -6) {
            pcVar5 = "___CTOR_LIST__";
          }
          pSVar2 = findlnksymbol(gv,pcVar5);
          return pSVar2;
        }
        pSVar2 = addlnksymbol(gv,__s1,0,'\x01','\x01','\x01','\x02',0);
        if (((((uVar7 & 0x1e) == 0x10) || ((uVar7 < 9 && ((0x119U >> (uVar7 & 0x1f) & 1) != 0)))) &&
            (pSVar2->type = '\x02', uVar7 < 9)) &&
           (((0x109U >> (uVar7 & 0x1f) & 1) != 0 &&
            (pSVar3 = findlnksymbol(gv,"_SDA_BASE_"), pSVar3 == (Symbol *)0x0)))) {
          pSVar3 = addlnksymbol(gv,"_SDA_BASE_",0,'\x01','\x01','\x01','\x02',0);
          pSVar3->type = '\x02';
          pSVar3->extra = 0x10;
        }
        pSVar2->extra = uVar7;
        return pSVar2;
      }
      lVar6 = lVar6 + -1;
      ppcVar4 = ppcVar4 + 1;
    } while (lVar6 != -0x12);
  }
  return (Symbol *)0x0;
}

Assistant:

static struct Symbol *ados_lnksym(struct GlobalVars *gv,struct Section *sec,
                                  struct Reloc *xref)
/* Checks, if undefined symbol is an ADOS-linker symbol */
{
  struct Symbol *sym;
  int i;

  if (!gv->dest_object) {
    for (i=0; i<=LAST_LNKSYM; i++) {
      if (!strcmp(ados_symnames[i],xref->xrefname)) {
        if (i==SASCT || i==SASDT) {
          /* map to ___CTOR_LIST__ / ___DTOR_LIST__ */
          return findlnksymbol(gv,(i == SASCT) ?
                                  "___CTOR_LIST__" : "___DTOR_LIST__");
        }
        else {
          sym = addlnksymbol(gv,ados_symnames[i],0,SYM_ABS,
                             SYMF_LNKSYM,SYMI_OBJECT,SYMB_GLOBAL,0);
          if (i==PHXDB || i==SASPT || i==SASBB || i==DICDB ||
              i==ELFSD || i==ELFS2) {
            sym->type = SYM_RELOC;
          }
          if ((i==SASPT || i==PHXDB || i==DICDB) &&
              findlnksymbol(gv,sdabase_name)==NULL) {
            /* Reference to _LinkerDB, _DATA_BAS_ or __DATA_BAS
               creates _SDA_BASE_ */
            struct Symbol *sdabase = addlnksymbol(gv,sdabase_name,0,SYM_ABS,
                                                  SYMF_LNKSYM,SYMI_OBJECT,
                                                  SYMB_GLOBAL,0);
            sdabase->type = SYM_RELOC;
            sdabase->extra = ELFSD;
          }
          sym->extra = i;  /* for easy identification in ados_setlnksym */
          return sym;  /* new linker symbol created */
        }
      }
    }
  }
  return NULL;
}